

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcarray.c
# Opt level: O3

LispPTR aref1(LispPTR array,int index)

{
  uint *puVar1;
  char cVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  uVar3 = (ulong)array;
  if ((array & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar3);
  }
  puVar1 = (uint *)(Lisp_world + uVar3);
  if ((int)puVar1[2] <= index) {
    printf("Invalid index in GC\'s AREF1:  0x%x\n",index);
    printf(" Array size limit:  0x%x\n",(ulong)puVar1[2]);
    printf(" Array ptr: 0x%x\n",uVar3);
    printf(" Array 68K ptr: %p\n",puVar1);
    printf("base:     0x%x\n",(ulong)(*puVar1 & 0xfffffff));
    printf("offset:   0x%x\n",(ulong)(ushort)puVar1[1]);
    printf("type #:   0x%x\n",(ulong)*(byte *)((long)puVar1 + 6));
    printf("fill ptr: 0x%x\n",(ulong)puVar1[3]);
    error("index out of range in GC\'s AREF1.");
  }
  lVar6 = (long)index + (ulong)(ushort)puVar1[1];
  cVar2 = *(char *)((long)puVar1 + 6);
  uVar4 = *puVar1 & 0xfffffff;
  iVar5 = (int)lVar6;
  if (cVar2 == '&') {
    if ((*puVar1 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar4);
    }
    uVar4 = *(uint *)(Lisp_world + (ulong)uVar4 + (long)iVar5 * 2);
  }
  else {
    if (cVar2 == '\x04') {
      uVar4 = (uint)*(ushort *)((ulong)(Lisp_world + (ulong)uVar4 + (long)iVar5) ^ 2);
    }
    else {
      if (cVar2 != '\x03') {
        error("Not Implemented in gc\'s aref1 (other types)");
        return 0;
      }
      uVar4 = (uint)*(byte *)((long)Lisp_world + lVar6 + (ulong)uVar4 * 2 ^ 3);
    }
    uVar4 = uVar4 | 0xe0000;
  }
  return uVar4;
}

Assistant:

LispPTR aref1(LispPTR array, int index) {
  LispPTR retval = 0;
  LispPTR base;
  short typenumber;
  struct arrayheader *actarray;

  actarray = (struct arrayheader *)NativeAligned4FromLAddr(array);
  if (index >= actarray->totalsize) {
    printf("Invalid index in GC's AREF1:  0x%x\n", index);
    printf(" Array size limit:  0x%x\n", actarray->totalsize);
    printf(" Array ptr: 0x%x\n", array);
    printf(" Array 68K ptr: %p\n", (void *)actarray);
    printf("base:     0x%x\n", actarray->base);
    printf("offset:   0x%x\n", actarray->offset);
    printf("type #:   0x%x\n", actarray->typenumber);
    printf("fill ptr: 0x%x\n", actarray->fillpointer);
    error("index out of range in GC's AREF1.");
  }
  index += actarray->offset;
  typenumber = actarray->typenumber;
  base = actarray->base;
  switch (typenumber) {
    case 3: /* unsigned 8bits */
      retval = (GETBYTE(((char *)NativeAligned2FromLAddr(base)) + index)) & 0x0ff;
      retval |= S_POSITIVE;
      break;
    case 4: /* unsigned 16bits */
      retval = (GETWORD(((DLword *)NativeAligned2FromLAddr(base)) + index)) & 0x0ffff;
      retval |= S_POSITIVE;
      break;
    case 38: retval = (*(((LispPTR *)NativeAligned4FromLAddr(base)) + index)); break;
    default: error("Not Implemented in gc's aref1 (other types)");
  }
  return (retval);
}